

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *__nptr;
  long lVar2;
  int r_1;
  double timeout;
  int value;
  int exception;
  int state;
  char **cmd_1;
  long test1Iterations;
  char *test1IterationsStr;
  char *cmd [4];
  uint local_268;
  int r;
  uint interruptDelays [10];
  int local_238 [2];
  int createNewGroups [10];
  int local_208 [2];
  int repeat [10];
  int local_1d8 [2];
  int polls [10];
  double local_1a8;
  double timeouts [10];
  int delays [10];
  int local_128 [2];
  int outputs [10];
  int local_f8 [2];
  int shares [10];
  int local_c8 [2];
  int values [10];
  int local_98 [2];
  int exceptions [10];
  int local_68 [2];
  int states [10];
  uint local_34;
  int n;
  char **argv_local;
  int argc_local;
  
  local_34 = 0;
  if (argc == 2) {
    local_34 = atoi(argv[1]);
  }
  else if ((argc == 3) && (iVar1 = strcmp(argv[1],"run"), iVar1 == 0)) {
    local_34 = atoi(argv[2]);
  }
  if ((((((int)local_34 < 1) || (10 < (int)local_34)) && (local_34 != 0x6c)) &&
      ((local_34 != 0x6d && (local_34 != 0x6e)))) || (argc != 3)) {
    if (((int)local_34 < 1) || (10 < (int)local_34)) {
      if ((argc < 3) || (iVar1 = strcmp(argv[1],"0"), iVar1 != 0)) {
        fprintf(_stdout,"Usage: %s <test number>\n",*argv);
        argv_local._4_4_ = 1;
      }
      else {
        argv_local._4_4_ = runChild(argv + 2,4,0,0,0,1,0,0.0,0,1,0,0,0);
      }
    }
    else {
      memcpy(local_68,&DAT_0010a1f0,0x28);
      memset(local_98,0,0x28);
      exceptions[1] = 1;
      exceptions[7] = 3;
      memset(local_c8,0,0x28);
      local_c8[1] = 0x7b;
      values[0] = 1;
      values[1] = 1;
      values[6] = 1;
      values[7] = 1;
      memset(local_f8,0,0x28);
      shares[6] = 1;
      shares[7] = 1;
      memcpy(local_128,&DAT_0010a220,0x28);
      memset(timeouts + 9,0,0x28);
      memcpy(&local_1a8,&DAT_0010a250,0x50);
      memset(local_1d8,0,0x28);
      polls[4] = 1;
      memcpy(local_208,&DAT_0010a2a0,0x28);
      memset(local_238,0,0x28);
      createNewGroups[6] = 1;
      createNewGroups[7] = 1;
      memset(&local_268,0,0x28);
      interruptDelays[6] = 3;
      interruptDelays[7] = 2;
      __nptr = getenv("KWSYS_TEST_PROCESS_1_COUNT");
      if (((__nptr != (char *)0x0) && (lVar2 = strtol(__nptr,(char **)0x0,10), 10 < lVar2)) &&
         (lVar2 != 0x7fffffffffffffff)) {
        local_208[0] = (int)lVar2;
      }
      test1IterationsStr = *argv;
      cmd[0] = "run";
      cmd[1] = argv[1];
      cmd[2] = (char *)0x0;
      fprintf(_stdout,"Output on stdout before test %d.\n",(ulong)local_34);
      fprintf(_stderr,"Output on stderr before test %d.\n",(ulong)local_34);
      fflush(_stdout);
      fflush(_stderr);
      argv_local._4_4_ =
           runChild(&test1IterationsStr,states[(long)(int)(local_34 - 1) + -2],
                    exceptions[(long)(int)(local_34 - 1) + -2],local_c8[(int)(local_34 - 1)],
                    shares[(long)(int)(local_34 - 1) + -2],outputs[(long)(int)(local_34 - 1) + -2],
                    delays[(long)(int)(local_34 - 1) + -2],timeouts[(long)(int)(local_34 - 1) + -1],
                    polls[(long)(int)(local_34 - 1) + -2],local_208[(int)(local_34 - 1)],0,
                    createNewGroups[(long)(int)(local_34 - 1) + -2],
                    (&local_268)[(int)(local_34 - 1)]);
      fprintf(_stdout,"Output on stdout after test %d.\n",(ulong)local_34);
      fprintf(_stderr,"Output on stderr after test %d.\n",(ulong)local_34);
      fflush(_stdout);
      fflush(_stderr);
    }
  }
  else {
    switch(local_34) {
    case 1:
      argv_local._4_4_ = test1(3,argv);
      break;
    case 2:
      argv_local._4_4_ = test2(3,argv);
      break;
    case 3:
      argv_local._4_4_ = test3(3,argv);
      break;
    case 4:
      argv_local._4_4_ = test4(3,argv);
      break;
    case 5:
      argv_local._4_4_ = test5(3,argv);
      break;
    case 6:
      test6(3,argv);
      argv_local._4_4_ = 0;
      break;
    case 7:
      argv_local._4_4_ = test7(3,argv);
      break;
    case 8:
      argv_local._4_4_ = test8(3,argv);
      break;
    case 9:
      argv_local._4_4_ = test9(3,argv);
      break;
    case 10:
      argv_local._4_4_ = test10(3,argv);
      break;
    default:
      fprintf(_stderr,"Invalid test number %d.\n",(ulong)local_34);
      argv_local._4_4_ = 1;
      break;
    case 0x6c:
      argv_local._4_4_ = test8_grandchild(3,argv);
      break;
    case 0x6d:
      argv_local._4_4_ = test9_grandchild(3,argv);
      break;
    case 0x6e:
      argv_local._4_4_ = test10_grandchild(3,argv);
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[])
{
  int n = 0;

#ifdef _WIN32
  int i;
  char new_args[10][_MAX_PATH];
  LPWSTR* w_av = CommandLineToArgvW(GetCommandLineW(), &argc);
  for (i = 0; i < argc; i++) {
    kwsysEncoding_wcstombs(new_args[i], w_av[i], _MAX_PATH);
    argv[i] = new_args[i];
  }
  LocalFree(w_av);
#endif

#if 0
    {
    HANDLE out = GetStdHandle(STD_OUTPUT_HANDLE);
    DuplicateHandle(GetCurrentProcess(), out,
                    GetCurrentProcess(), &out, 0, FALSE,
                    DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE);
    SetStdHandle(STD_OUTPUT_HANDLE, out);
    }
    {
    HANDLE out = GetStdHandle(STD_ERROR_HANDLE);
    DuplicateHandle(GetCurrentProcess(), out,
                    GetCurrentProcess(), &out, 0, FALSE,
                    DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE);
    SetStdHandle(STD_ERROR_HANDLE, out);
    }
#endif
  if (argc == 2) {
    n = atoi(argv[1]);
  } else if (argc == 3 && strcmp(argv[1], "run") == 0) {
    n = atoi(argv[2]);
  }
  /* Check arguments.  */
  if (((n >= 1 && n <= 10) || n == 108 || n == 109 || n == 110) && argc == 3) {
    /* This is the child process for a requested test number.  */
    switch (n) {
      case 1:
        return test1(argc, argv);
      case 2:
        return test2(argc, argv);
      case 3:
        return test3(argc, argv);
      case 4:
        return test4(argc, argv);
      case 5:
        return test5(argc, argv);
      case 6:
        test6(argc, argv);
        return 0;
      case 7:
        return test7(argc, argv);
      case 8:
        return test8(argc, argv);
      case 9:
        return test9(argc, argv);
      case 10:
        return test10(argc, argv);
      case 108:
        return test8_grandchild(argc, argv);
      case 109:
        return test9_grandchild(argc, argv);
      case 110:
        return test10_grandchild(argc, argv);
    }
    fprintf(stderr, "Invalid test number %d.\n", n);
    return 1;
  } else if (n >= 1 && n <= 10) {
    /* This is the parent process for a requested test number.  */
    int states[10] = {
      kwsysProcess_State_Exited,   kwsysProcess_State_Exited,
      kwsysProcess_State_Expired,  kwsysProcess_State_Exception,
      kwsysProcess_State_Exited,   kwsysProcess_State_Expired,
      kwsysProcess_State_Exited,   kwsysProcess_State_Exited,
      kwsysProcess_State_Expired,  /* Ctrl+C handler test */
      kwsysProcess_State_Exception /* Process group test */
    };
    int exceptions[10] = {
      kwsysProcess_Exception_None,  kwsysProcess_Exception_None,
      kwsysProcess_Exception_None,
#ifdef CRASH_USING_ABORT
      kwsysProcess_Exception_Other,
#else
      kwsysProcess_Exception_Fault,
#endif
      kwsysProcess_Exception_None,  kwsysProcess_Exception_None,
      kwsysProcess_Exception_None,  kwsysProcess_Exception_None,
      kwsysProcess_Exception_None,  kwsysProcess_Exception_Interrupt
    };
    int values[10] = { 0, 123, 1, 1, 0, 0, 0, 0, 1, 1 };
    int shares[10] = { 0, 0, 0, 0, 0, 0, 0, 0, 1, 1 };
    int outputs[10] = { 1, 1, 1, 1, 1, 0, 1, 1, 1, 1 };
    int delays[10] = { 0, 0, 0, 0, 0, 1, 0, 0, 0, 0 };
    double timeouts[10] = { 10, 10, 10, 30, 30, 10, -1, 10, 6, 4 };
    int polls[10] = { 0, 0, 0, 0, 0, 0, 1, 0, 0, 0 };
    int repeat[10] = { 257, 1, 1, 1, 1, 1, 1, 1, 1, 1 };
    int createNewGroups[10] = { 0, 0, 0, 0, 0, 0, 0, 0, 1, 1 };
    unsigned int interruptDelays[10] = { 0, 0, 0, 0, 0, 0, 0, 0, 3, 2 };
    int r;
    const char* cmd[4];
#ifdef _WIN32
    char* argv0 = 0;
#endif
    char* test1IterationsStr = getenv("KWSYS_TEST_PROCESS_1_COUNT");
    if (test1IterationsStr) {
      long int test1Iterations = strtol(test1IterationsStr, 0, 10);
      if (test1Iterations > 10 && test1Iterations != LONG_MAX) {
        repeat[0] = (int)test1Iterations;
      }
    }
#ifdef _WIN32
    if (n == 0 && (argv0 = strdup(argv[0]))) {
      /* Try converting to forward slashes to see if it works.  */
      char* c;
      for (c = argv0; *c; ++c) {
        if (*c == '\\') {
          *c = '/';
        }
      }
      cmd[0] = argv0;
    } else {
      cmd[0] = argv[0];
    }
#else
    cmd[0] = argv[0];
#endif
    cmd[1] = "run";
    cmd[2] = argv[1];
    cmd[3] = 0;
    fprintf(stdout, "Output on stdout before test %d.\n", n);
    fprintf(stderr, "Output on stderr before test %d.\n", n);
    fflush(stdout);
    fflush(stderr);
    r = runChild(cmd, states[n - 1], exceptions[n - 1], values[n - 1],
                 shares[n - 1], outputs[n - 1], delays[n - 1], timeouts[n - 1],
                 polls[n - 1], repeat[n - 1], 0, createNewGroups[n - 1],
                 interruptDelays[n - 1]);
    fprintf(stdout, "Output on stdout after test %d.\n", n);
    fprintf(stderr, "Output on stderr after test %d.\n", n);
    fflush(stdout);
    fflush(stderr);
#if defined(_WIN32)
    free(argv0);
#endif
    return r;
  } else if (argc > 2 && strcmp(argv[1], "0") == 0) {
    /* This is the special debugging test to run a given command
       line.  */
    const char** cmd = argv + 2;
    int state = kwsysProcess_State_Exited;
    int exception = kwsysProcess_Exception_None;
    int value = 0;
    double timeout = 0;
    int r =
      runChild(cmd, state, exception, value, 0, 1, 0, timeout, 0, 1, 0, 0, 0);
    return r;
  } else {
    /* Improper usage.  */
    fprintf(stdout, "Usage: %s <test number>\n", argv[0]);
    return 1;
  }
}